

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::find_conflict_level(Internal *this,int *forced)

{
  int iVar1;
  Clause *pCVar2;
  Clause *pCVar3;
  Var *pVVar4;
  int *in_RSI;
  Internal *in_RDI;
  int tmp_1;
  int other;
  int j;
  int highest_level;
  int highest_literal;
  int highest_position;
  int lit_1;
  int i;
  int *lits;
  int size;
  int tmp;
  int *lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  int count;
  int res;
  int in_stack_ffffffffffffff8c;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int blit;
  int iVar9;
  int lit_00;
  int iVar10;
  Clause *clause;
  Clause *this_00;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  *in_RSI = 0;
  this_00 = in_RDI->conflict;
  pCVar2 = (Clause *)Clause::begin(this_00);
  pCVar3 = (Clause *)Clause::end(this_00);
  while (clause = pCVar2, pCVar2 != pCVar3) {
    pVVar4 = var(in_RDI,in_stack_ffffffffffffff8c);
    iVar1 = pVVar4->level;
    if (local_14 < iVar1) {
      *in_RSI = *(int *)&pCVar2->field_0;
      local_18 = 1;
      local_14 = iVar1;
    }
    else if (((iVar1 == local_14) && (local_18 = local_18 + 1, local_14 == in_RDI->level)) &&
            (1 < local_18)) break;
    pCVar2 = (Clause *)((long)&clause->field_0 + 4);
  }
  iVar1 = in_RDI->conflict->size;
  pCVar2 = in_RDI->conflict;
  lit_00 = 0;
  do {
    if (1 < lit_00) {
      if (local_18 != 1) {
        *in_RSI = 0;
      }
      return local_14;
    }
    iVar8 = *(int *)((long)&pCVar2[1].field_0 + (long)lit_00 * 4);
    iVar9 = iVar8;
    iVar10 = lit_00;
    pVVar4 = var(in_RDI,in_stack_ffffffffffffff8c);
    iVar6 = pVVar4->level;
    iVar5 = iVar10;
    do {
      iVar5 = iVar5 + 1;
      iVar7 = iVar6;
      blit = iVar8;
      if (iVar1 <= iVar5) break;
      blit = *(int *)((long)&pCVar2[1].field_0 + (long)iVar5 * 4);
      pVVar4 = var(in_RDI,in_stack_ffffffffffffff8c);
      iVar7 = pVVar4->level;
    } while ((iVar7 <= iVar6) || (iVar6 = iVar7, iVar8 = blit, lit_00 = iVar5, iVar7 != local_14));
    if (lit_00 != iVar10) {
      if (1 < lit_00) {
        watches(in_RDI,in_stack_ffffffffffffff8c);
        remove_watch((Watches *)this_00,clause);
      }
      *(int *)((long)&pCVar2[1].field_0 + (long)lit_00 * 4) = iVar9;
      *(int *)((long)&pCVar2[1].field_0 + (long)iVar10 * 4) = blit;
      if (1 < lit_00) {
        watch_literal((Internal *)CONCAT44(iVar10,iVar9),lit_00,blit,(Clause *)CONCAT44(iVar7,iVar5)
                     );
      }
    }
    lit_00 = iVar10 + 1;
  } while( true );
}

Assistant:

inline int Internal::find_conflict_level (int &forced) {

  assert (conflict);
  assert (opts.chrono || opts.otfs || external_prop);

  int res = 0, count = 0;

  forced = 0;

  for (const auto &lit : *conflict) {
    const int tmp = var (lit).level;
    if (tmp > res) {
      res = tmp;
      forced = lit;
      count = 1;
    } else if (tmp == res) {
      count++;
      if (res == level && count > 1)
        break;
    }
  }

  LOG ("%d literals on actual conflict level %d", count, res);

  const int size = conflict->size;
  int *lits = conflict->literals;

  // Move the two highest level literals to the front.
  //
  for (int i = 0; i < 2; i++) {

    const int lit = lits[i];

    int highest_position = i;
    int highest_literal = lit;
    int highest_level = var (highest_literal).level;

    for (int j = i + 1; j < size; j++) {
      const int other = lits[j];
      const int tmp = var (other).level;
      if (highest_level >= tmp)
        continue;
      highest_literal = other;
      highest_position = j;
      highest_level = tmp;
      if (highest_level == res)
        break;
    }

    // No unwatched higher assignment level literal.
    //
    if (highest_position == i)
      continue;

    if (highest_position > 1) {
      LOG (conflict, "unwatch %d in", lit);
      remove_watch (watches (lit), conflict);
    }

    lits[highest_position] = lit;
    lits[i] = highest_literal;

    if (highest_position > 1)
      watch_literal (highest_literal, lits[!i], conflict);
  }

  // Only if the number of highest level literals in the conflict is one
  // then we can reuse the conflict clause as driving clause for 'forced'.
  //
  if (count != 1)
    forced = 0;

  return res;
}